

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O0

ion_err_t sl_destroy(ion_skiplist_t *skiplist)

{
  sl_node *psVar1;
  ion_sl_node_t *tofree;
  ion_sl_node_t *cursor;
  ion_skiplist_t *skiplist_local;
  
  tofree = skiplist->head;
  while (tofree != (ion_sl_node_t *)0x0) {
    psVar1 = *tofree->next;
    free(tofree->key);
    free(tofree->value);
    free(tofree->next);
    free(tofree);
    tofree = psVar1;
  }
  skiplist->head = (ion_sl_node_t *)0x0;
  return '\0';
}

Assistant:

ion_err_t
sl_destroy(
	ion_skiplist_t *skiplist
) {
	ion_sl_node_t *cursor = skiplist->head, *tofree;

	while (cursor != NULL) {
		tofree	= cursor;
		cursor	= cursor->next[0];
		free(tofree->key);
		free(tofree->value);
		free(tofree->next);
		free(tofree);
	}

	skiplist->head = NULL;

	return err_ok;
}